

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O1

Triangle * __thiscall SceneParser::parseTriangle(SceneParser *this)

{
  Triangle *this_00;
  Vector3f v1;
  Vector3f v2;
  Vector3f v0;
  Vector3f n;
  Vector3f b;
  Vector3f a;
  char token [100];
  
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x18b,"Triangle *SceneParser::parseTriangle()");
  }
  getToken(this,token);
  if (CONCAT62(token._2_6_,token._0_2_) != 0x30786574726576) {
    __assert_fail("!strcmp(token, \"vertex0\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x18d,"Triangle *SceneParser::parseTriangle()");
  }
  readVector3f((SceneParser *)&v0);
  getToken(this,token);
  if (CONCAT62(token._2_6_,token._0_2_) != 0x31786574726576) {
    __assert_fail("!strcmp(token, \"vertex1\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,400,"Triangle *SceneParser::parseTriangle()");
  }
  readVector3f((SceneParser *)&v1);
  getToken(this,token);
  if (CONCAT62(token._2_6_,token._0_2_) == 0x32786574726576) {
    readVector3f((SceneParser *)&v2);
    getToken(this,token);
    if (token._0_2_ != 0x7d) {
      __assert_fail("!strcmp(token, \"}\")",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                    ,0x196,"Triangle *SceneParser::parseTriangle()");
    }
    if (this->_current_material != (Material *)0x0) {
      operator-(&v1,&v0);
      operator-(&v2,&v0);
      Vector3f::cross(&a,&b);
      Vector3f::normalized(&n);
      this_00 = (Triangle *)operator_new(0x78);
      Triangle::Triangle(this_00,&v0,&v1,&v2,&n,&n,&n,this->_current_material);
      return this_00;
    }
    __assert_fail("_current_material != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0x197,"Triangle *SceneParser::parseTriangle()");
  }
  __assert_fail("!strcmp(token, \"vertex2\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0x193,"Triangle *SceneParser::parseTriangle()");
}

Assistant:

Triangle *
SceneParser::parseTriangle() {
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));
    getToken(token);
    assert(!strcmp(token, "vertex0"));
    Vector3f v0 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "vertex1"));
    Vector3f v1 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "vertex2"));
    Vector3f v2 = readVector3f();
    getToken(token);
    assert(!strcmp(token, "}"));
    assert(_current_material != NULL);
    Vector3f a = v1 - v0;
    Vector3f b = v2 - v0;
    Vector3f n = Vector3f::cross(a, b).normalized();
    return new Triangle(v0, v1, v2, n, n, n, _current_material);
}